

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

PAL_ERROR CorUnix::InternalOpenFileMapping
                    (CPalThread *pThread,DWORD dwDesiredAccess,BOOL bInheritHandle,LPCWSTR lpName,
                    HANDLE *phMapping)

{
  PAL_ERROR PVar1;
  size_t sVar2;
  LPCWSTR local_50;
  CPalString sObjectName;
  long *local_38;
  IPalObject *pFileMapping;
  
  local_38 = (long *)0x0;
  sVar2 = PAL_wcslen(lpName);
  sObjectName.m_pwsz._0_4_ = (int)sVar2;
  sObjectName.m_pwsz._4_4_ = (int)sObjectName.m_pwsz + 1;
  local_50 = lpName;
  if ((dwDesiredAccess < 7) && ((0x56U >> (dwDesiredAccess & 0x1f) & 1) != 0)) {
    sObjectName._8_8_ = phMapping;
    PVar1 = (**(code **)(*g_pObjectManager + 0x10))
                      (g_pObjectManager,pThread,&local_50,&aotFileMapping,&local_38);
    if (PVar1 == 0) {
      PVar1 = (**(code **)(*g_pObjectManager + 0x18))
                        (g_pObjectManager,pThread,local_38,dwDesiredAccess,bInheritHandle != 0,0,
                         sObjectName._8_8_);
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalOpenFileMapping",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x367);
    fprintf(_stderr,
            "dwDesiredAccess can be one or more of FILE_MAP_READ, FILE_MAP_WRITE, FILE_MAP_COPY or FILE_MAP_ALL_ACCESS.\n"
           );
    PVar1 = 0x57;
  }
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 0x40))(local_38,pThread);
  }
  return PVar1;
}

Assistant:

PAL_ERROR
CorUnix::InternalOpenFileMapping(
    CPalThread *pThread,
    DWORD dwDesiredAccess,
    BOOL bInheritHandle,
    LPCWSTR lpName,
    HANDLE *phMapping
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pFileMapping = NULL;
    CPalString sObjectName(lpName);

    if ( MAPContainsInvalidFlags( dwDesiredAccess ) ) 
    {
        ASSERT( "dwDesiredAccess can be one or more of FILE_MAP_READ, " 
               "FILE_MAP_WRITE, FILE_MAP_COPY or FILE_MAP_ALL_ACCESS.\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto ExitInternalOpenFileMapping;
    }

    palError = g_pObjectManager->LocateObject(
        pThread,
        &sObjectName,
        &aotFileMapping, 
        &pFileMapping
        );

    if (NO_ERROR != palError)
    {
        goto ExitInternalOpenFileMapping;
    }

    palError = g_pObjectManager->ObtainHandleForObject(
        pThread,
        pFileMapping,
        dwDesiredAccess,
        bInheritHandle,
        NULL,
        phMapping
        );

    if (NO_ERROR != palError)
    {
        goto ExitInternalOpenFileMapping;
    }

ExitInternalOpenFileMapping:

    if (NULL != pFileMapping)
    {
        pFileMapping->ReleaseReference(pThread);
    }
    
    return palError;
}